

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O3

void Ifd_ManStop(Ifd_Man_t *p)

{
  uint uVar1;
  Hsh_IntMan_t *__ptr;
  int *__ptr_00;
  word *__ptr_01;
  Vec_Int_t *pVVar2;
  uint uVar3;
  Vec_Wrd_t *pVVar4;
  long lVar5;
  
  pVVar2 = p->vMarks;
  if (1 < pVVar2->nSize) {
    lVar5 = 1;
    uVar3 = 0;
    do {
      uVar1 = pVVar2->pArray[lVar5];
      printf("%d(%d:%d) ",(ulong)((int)lVar5 - 1),(ulong)uVar1,(ulong)(uVar1 - uVar3));
      lVar5 = lVar5 + 1;
      pVVar2 = p->vMarks;
      uVar3 = uVar1;
    } while (lVar5 < pVVar2->nSize);
  }
  putchar(10);
  pVVar2 = p->vArgs;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      p->vArgs->pArray = (int *)0x0;
      pVVar2 = p->vArgs;
      if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_0040b3c9;
    }
    free(pVVar2);
    p->vArgs = (Vec_Int_t *)0x0;
  }
LAB_0040b3c9:
  pVVar2 = p->vRes;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      p->vRes->pArray = (int *)0x0;
      pVVar2 = p->vRes;
      if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_0040b405;
    }
    free(pVVar2);
    p->vRes = (Vec_Int_t *)0x0;
  }
LAB_0040b405:
  pVVar4 = p->vTruths;
  if (pVVar4 != (Vec_Wrd_t *)0x0) {
    if (pVVar4->pArray != (word *)0x0) {
      free(pVVar4->pArray);
      p->vTruths->pArray = (word *)0x0;
      pVVar4 = p->vTruths;
      if (pVVar4 == (Vec_Wrd_t *)0x0) goto LAB_0040b441;
    }
    free(pVVar4);
    p->vTruths = (Vec_Wrd_t *)0x0;
  }
LAB_0040b441:
  pVVar2 = p->vClauses;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      p->vClauses->pArray = (int *)0x0;
      pVVar2 = p->vClauses;
      if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_0040b47d;
    }
    free(pVVar2);
    p->vClauses = (Vec_Int_t *)0x0;
  }
LAB_0040b47d:
  pVVar2 = p->vMarks;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      p->vMarks->pArray = (int *)0x0;
      pVVar2 = p->vMarks;
      if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_0040b4b9;
    }
    free(pVVar2);
    p->vMarks = (Vec_Int_t *)0x0;
  }
LAB_0040b4b9:
  __ptr = p->vHash;
  pVVar2 = __ptr->vTable;
  __ptr_00 = pVVar2->pArray;
  if (__ptr_00 != (int *)0x0) {
    free(__ptr_00);
  }
  free(pVVar2);
  pVVar4 = __ptr->vObjs;
  __ptr_01 = pVVar4->pArray;
  if (__ptr_01 != (word *)0x0) {
    free(__ptr_01);
  }
  free(pVVar4);
  free(__ptr);
  pVVar2 = p->vSuper;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      p->vSuper->pArray = (int *)0x0;
      pVVar2 = p->vSuper;
      if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_0040b535;
    }
    free(pVVar2);
    p->vSuper = (Vec_Int_t *)0x0;
  }
LAB_0040b535:
  if (p->pObjs != (Ifd_Obj_t *)0x0) {
    free(p->pObjs);
  }
  free(p);
  return;
}

Assistant:

void Ifd_ManStop( Ifd_Man_t * p )
{
    int i, This, Prev = 0;
    Vec_IntForEachEntryStart( p->vMarks, This, i, 1 )
    {
        printf( "%d(%d:%d) ", i-1, This, This - Prev );
        Prev = This;
    }
    printf( "\n" );

    Vec_IntFreeP( &p->vArgs );
    Vec_IntFreeP( &p->vRes );
    Vec_WrdFreeP( &p->vTruths );
    Vec_IntFreeP( &p->vClauses );
    Vec_IntFreeP( &p->vMarks );
    Hsh_IntManStop( p->vHash );
    Vec_IntFreeP( &p->vSuper );
    ABC_FREE( p->pObjs );
    ABC_FREE( p );
}